

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O1

void __thiscall deci::ast_postfix_t::~ast_postfix_t(ast_postfix_t *this)

{
  ast_arg_list_t *this_00;
  pointer pcVar1;
  
  this_00 = this->arglist;
  if (this_00 != (ast_arg_list_t *)0x0) {
    ast_arg_list_t::~ast_arg_list_t(this_00);
    operator_delete(this_00);
  }
  pcVar1 = (this->identifier)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->identifier).field_2) {
    operator_delete(pcVar1);
  }
  (this->super_ast_item_t)._vptr_ast_item_t = (_func_int **)&PTR_EndLocationTag_abi_cxx11__0011e3c8;
  return;
}

Assistant:

ast_postfix_t::~ast_postfix_t() {
    delete this->arglist;
  }